

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingTools.hpp
# Opt level: O3

char * Diligent::Parsing::SkipIdentifier<char_const*>(char **Start,char **End)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  
  pcVar5 = *Start;
  pcVar2 = *End;
  if ((pcVar5 != pcVar2) &&
     ((cVar1 = *pcVar5, iVar4 = isalpha((int)cVar1), cVar1 == 0x5f || (iVar4 != 0)))) {
    pcVar3 = pcVar5 + 1;
    do {
      pcVar5 = pcVar3;
      if (pcVar5 == pcVar2) {
        return pcVar2;
      }
      cVar1 = *pcVar5;
      iVar4 = isalnum((int)cVar1);
      pcVar3 = pcVar5 + 1;
    } while ((cVar1 == 0x5f) || (iVar4 != 0));
  }
  return pcVar5;
}

Assistant:

IteratorType SkipIdentifier(const IteratorType& Start, const IteratorType& End) noexcept
{
    if (Start == End)
        return Start;

    auto Pos = Start;
    if (isalpha(*Pos) || *Pos == '_')
        ++Pos;
    else
        return Pos;

    while (Pos != End && (isalnum(*Pos) || *Pos == '_'))
        ++Pos;

    return Pos;
}